

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-utils.h
# Opt level: O2

uint64_t dg::llvmutils::getConstantSizeValue(Value *op)

{
  uint64_t uVar1;
  
  uVar1 = getConstantValue(op);
  if (uVar1 == 0xffffffffffffffff) {
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

inline uint64_t getConstantSizeValue(const llvm::Value *op) {
    auto sz = getConstantValue(op);
    // if the size is unknown, make it 0, so that pointer
    // analysis correctly computes offets into this memory
    // (which is always UNKNOWN)
    if (sz == ~static_cast<uint64_t>(0))
        return 0;
    return sz;
}